

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,OptionCallback *target,string_view param_2,
          string_view value)

{
  pointer p;
  pointer pbVar1;
  undefined8 uVar2;
  pointer pbVar3;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar4;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50 [32];
  
  local_68 = local_50;
  local_60 = 0;
  local_58 = 2;
  value_00._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  value_00._M_len = (size_t)value._M_str;
  value_00._M_str._4_4_ = 0;
  sVar4 = parseList((slang *)value._M_len,value_00,SUB81(&local_68,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    param_2._M_str);
  pbVar1 = sVar4._M_ptr;
  if (sVar4._M_extent._M_extent_value._M_extent_value != 0) {
    pbVar3 = pbVar1 + sVar4._M_extent._M_extent_value._M_extent_value;
    do {
      local_78._M_len._0_4_ = (undefined4)pbVar1->_M_len;
      local_78._M_len._4_4_ = *(undefined4 *)((long)&pbVar1->_M_len + 4);
      local_78._M_str._0_4_ = *(undefined4 *)&pbVar1->_M_str;
      local_78._M_str._4_4_ = *(undefined4 *)((long)&pbVar1->_M_str + 4);
      if ((target->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar2 = std::__throw_bad_function_call();
        if (local_68 != local_50) {
          operator_delete(local_68);
        }
        _Unwind_Resume(uVar2);
      }
      (*target->_M_invoker)(__return_storage_ptr__,(_Any_data *)target,&local_78);
      if (__return_storage_ptr__->_M_string_length != 0) goto LAB_00229b93;
      p = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p != &__return_storage_ptr__->field_2) {
        operator_delete(p,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
      }
      pbVar1 = pbVar1 + 1;
    } while (pbVar1 != pbVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00229b93:
  if (local_68 != local_50) {
    operator_delete(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(OptionCallback& target, std::string_view,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem)) {
        auto result = target(entry);
        if (!result.empty())
            return result;
    }
    return {};
}